

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
        *this)

{
  bool bVar1;
  size_t sVar2;
  iterator __end0;
  iterator __begin0;
  OUT OStack_218;
  iterator local_1f8;
  iterator local_160;
  iterator local_c8;
  
  begin(&local_160,this);
  end(&local_1f8,this);
  sVar2 = 0;
  while( true ) {
    iterator::iterator(&local_c8,&local_1f8);
    bVar1 = iterator::operator!=(&local_160,&local_c8);
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
    ::~GroupByState(&local_c8.source);
    if (!bVar1) break;
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
    ::Current(&OStack_218,&local_160.source);
    sVar2 = sVar2 + 1;
    IEnumerable<int_&>::~IEnumerable(&OStack_218.super_IEnumerable<int_&>);
    iterator::operator++(&local_160);
  }
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  ::~GroupByState(&local_1f8.source);
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  ::~GroupByState(&local_160.source);
  return sVar2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}